

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_server.cpp
# Opt level: O1

MPP_RET send_task(MppDevMppService *ctx)

{
  int iVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long lVar4;
  long *plVar5;
  undefined8 *puVar6;
  long *plVar7;
  long *plVar8;
  MPP_RET MVar9;
  undefined8 in_RAX;
  undefined8 uVar10;
  undefined4 uVar11;
  
  uVar11 = (undefined4)((ulong)in_RAX >> 0x20);
  puVar2 = (undefined8 *)ctx->serv_ctx;
  if ((puVar2 == (undefined8 *)0x0) ||
     (puVar3 = (undefined8 *)puVar2[8], puVar3 == (undefined8 *)0x0)) {
    _mpp_log_l(2,"mpp_server","invalid ctx %p session %p send task\n","send_task",ctx,puVar2);
    MVar9 = MPP_NOK;
  }
  else {
    pthread_mutex_lock((pthread_mutex_t *)*puVar2);
    plVar8 = (undefined8 *)puVar2[5] + -2;
    if ((undefined8 *)puVar2[5] == puVar2 + 5) {
      uVar10 = CONCAT44(uVar11,0x1df);
      _mpp_log_l(2,"mpp_server","Assertion %s failed at %s:%d\n",(char *)0x0,"task","send_task",
                 uVar10);
      uVar11 = (undefined4)((ulong)uVar10 >> 0x20);
      plVar8 = (long *)0x0;
      if ((mpp_debug._3_1_ & 0x10) != 0) {
        abort();
      }
    }
    plVar8[10] = (long)ctx->reqs;
    *(RK_S32 *)(plVar8 + 0xb) = ctx->req_cnt;
    plVar7 = plVar8 + 2;
    lVar4 = plVar8[2];
    plVar5 = (long *)plVar8[3];
    *(long **)(lVar4 + 8) = plVar5;
    *plVar5 = lVar4;
    plVar8[2] = (long)plVar7;
    plVar8[3] = (long)plVar7;
    puVar6 = (undefined8 *)puVar2[4];
    puVar2[4] = plVar7;
    plVar8[2] = (long)(puVar2 + 3);
    plVar8[3] = (long)puVar6;
    *puVar6 = plVar7;
    *(int *)((long)puVar2 + 0x4c) = *(int *)((long)puVar2 + 0x4c) + 1;
    pthread_mutex_unlock((pthread_mutex_t *)*puVar2);
    pthread_mutex_lock((pthread_mutex_t *)*puVar3);
    iVar1 = *(int *)(puVar3 + 2);
    *(int *)(puVar3 + 2) = iVar1 + 1;
    *(int *)((long)plVar8 + 0x44) = iVar1;
    lVar4 = *plVar8;
    plVar7 = (long *)plVar8[1];
    *(long **)(lVar4 + 8) = plVar7;
    *plVar7 = lVar4;
    *plVar8 = (long)plVar8;
    plVar8[1] = (long)plVar8;
    puVar6 = (undefined8 *)puVar3[0x10];
    puVar3[0x10] = plVar8;
    *plVar8 = (long)(puVar3 + 0xf);
    plVar8[1] = (long)puVar6;
    *puVar6 = plVar8;
    iVar1 = *(int *)(puVar3 + 0x11);
    *(int *)(puVar3 + 0x11) = iVar1 + 1;
    if (((byte)mpp_server_debug & 1) != 0) {
      _mpp_log_l(4,"mpp_server","session %d:%d add pending %d\n",(char *)0x0,
                 (ulong)*(uint *)(puVar2 + 9),(ulong)*(uint *)(plVar8 + 8),
                 CONCAT44(uVar11,iVar1 + 1));
    }
    mpp_timer_set_enable((MppTimer)puVar3[3],1);
    pthread_mutex_unlock((pthread_mutex_t *)*puVar3);
    MVar9 = MPP_OK;
  }
  return MVar9;
}

Assistant:

MPP_RET send_task(MppDevMppService *ctx)
{
    MppDevTask *task = NULL;
    MppDevSession *session = (MppDevSession *)ctx->serv_ctx;

    if (NULL == session || NULL == session->server) {
        mpp_err_f("invalid ctx %p session %p send task\n", ctx, session);
        return MPP_NOK;
    }

    MppDevBatServ *server = session->server;

    /* get free task from session and add to run list */
    session->cond->lock();
    /* get a free task and setup */
    task = list_first_entry_or_null(&session->list_done, MppDevTask, link_session);
    mpp_assert(task);

    task->req = ctx->reqs;
    task->req_cnt = ctx->req_cnt;

    list_del_init(&task->link_session);
    list_add_tail(&task->link_session, &session->list_wait);

    session->task_wait++;
    session->cond->unlock();

    server->lock->lock();
    task->task_id = server->task_id++;
    list_del_init(&task->link_server);
    list_add_tail(&task->link_server, &server->pending_task);
    server->pending_count++;
    mpp_serv_dbg_flow("session %d:%d add pending %d\n",
                      session->client, task->slot_idx, server->pending_count);

    mpp_timer_set_enable(server->timer, 1);
    server->lock->unlock();

    return MPP_OK;
}